

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O1

void __thiscall duckdb::StorageLockKey::~StorageLockKey(StorageLockKey *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  StorageLockInternals *pSVar1;
  
  if (this->type == EXCLUSIVE) {
    pSVar1 = shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&this->internals);
    pthread_mutex_unlock((pthread_mutex_t *)&pSVar1->exclusive_lock);
  }
  else {
    pSVar1 = shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&this->internals);
    LOCK();
    (pSVar1->read_count).super___atomic_base<unsigned_long>._M_i =
         (pSVar1->read_count).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  }
  this_00 = (this->internals).internal.
            super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

StorageLockKey::~StorageLockKey() {
	if (type == StorageLockType::EXCLUSIVE) {
		internals->ReleaseExclusiveLock();
	} else {
		D_ASSERT(type == StorageLockType::SHARED);
		internals->ReleaseSharedLock();
	}
}